

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

void gb_log(gb_log_level_e level,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_d8;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Da;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  if (log_handler != (gb_log_handler_t)0x0) {
    local_a8 = in_RDX;
    local_a0 = in_RCX;
    local_98 = in_R8;
    local_90 = in_R9;
    if (fmt == (char *)0x0) {
      __assert_fail("fmt != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/log.c"
                    ,0x1e,"void gb_log(gb_log_level_e, const char *, ...)");
    }
    local_d8.reg_save_area = local_b8;
    local_d8.gp_offset = 0x10;
    local_d8.fp_offset = 0x30;
    local_d8.overflow_arg_area = &args[0].overflow_arg_area;
    (*log_handler)(level,fmt,&local_d8);
  }
  return;
}

Assistant:

void gb_log(gb_log_level_e level, const char *fmt, ...)
{
    if (log_handler == NULL)
        return;

    assert(fmt != NULL);

    va_list args = {0};
    va_start(args, fmt);
    log_handler(level, fmt, args);
    va_end(args);
}